

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void AdditionHelper<char,_unsigned_long,_14>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,unsigned_long *rhs,char *result)

{
  int iVar1;
  int iVar2;
  
  if (*rhs >> 0x20 == 0) {
    iVar2 = (int)*lhs;
    iVar1 = (int)*rhs + iVar2;
    if (((iVar2 <= iVar1) && ((char)iVar1 == iVar1)) && (*result = (char)iVar1, iVar2 <= iVar1)) {
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // rhs is std::uint64_t, lhs signed, 32-bit or less

        if( (std::uint32_t)( rhs >> 32 ) == 0 )
        {
            // Now it just happens to work out that the standard behavior does what we want
            // Adding explicit casts to show exactly what's happening here
            std::uint32_t tmp = (std::uint32_t)rhs + (std::uint32_t)lhs;

            if( (std::int32_t)tmp >= lhs )
            {
                SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::template CastThrow< E >( (std::int32_t)tmp, result );
                return;
            }
        }
        E::SafeIntOnOverflow();
    }